

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<SchemeObject> __thiscall SchemePromise::force(SchemePromise *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<SchemeObject> sVar1;
  undefined1 local_60 [24];
  __uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_> local_48;
  undefined8 local_40;
  ExecutionResult local_38;
  
  if (*(long *)(in_RSI + 8) == 0) {
    local_60._16_8_ = (long)local_60 + 0x10;
    local_40 = 0;
    local_48._M_t.super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
    super__Head_base<0UL,_TailContext_*,_false>._M_head_impl =
         (tuple<TailContext_*,_std::default_delete<TailContext>_>)
         (tuple<TailContext_*,_std::default_delete<TailContext>_>)local_60._16_8_;
    SchemeProcedure::execute
              (&local_38,*(SchemeProcedure **)(in_RSI + 0x18),
               (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *)local_60._16_8_);
    ExecutionResult::force_value((ExecutionResult *)local_60);
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8),
               (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    ExecutionResult::~ExecutionResult(&local_38);
    std::__cxx11::
    _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
    _M_clear((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
              *)(local_60 + 0x10));
    std::__shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x18))
    ;
  }
  std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  sVar1.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_SchemeObject;
  return (shared_ptr<SchemeObject>)
         sVar1.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeObject> SchemePromise::force()
{
    if(!value)
    {
        value = func->execute({}).force_value();
        func.reset();
    }
    return value;
}